

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketutils.cpp
# Opt level: O3

bool myutils::check_connect(SOCKET sock,int timeout_second)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  fd_set *__exceptfds;
  ulong uVar6;
  timeval *in_R8;
  socklen_t len;
  int err;
  fd_set wset;
  fd_set rset;
  socklen_t local_138;
  int local_134;
  fd_set local_130;
  fd_set local_b0;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  lVar4 = std::chrono::_V2::system_clock::now();
  lVar5 = (long)timeout_second;
  if (SBORROW8(lVar4 - lVar3,lVar5 * 1000000000) != (lVar4 - lVar3) + lVar5 * -1000000000 < 0) {
    iVar2 = sock + 0x3f;
    if (-1 < sock) {
      iVar2 = sock;
    }
    __exceptfds = (fd_set *)(ulong)(uint)(sock % 0x40);
    uVar6 = 1L << ((byte)(sock % 0x40) & 0x3f);
    do {
      iVar1 = select(sock,&local_b0,&local_130,__exceptfds,in_R8);
      if (1 < iVar1 + 1U) {
        if ((local_b0.fds_bits[iVar2 >> 6] & uVar6) != 0) {
          local_134 = 0;
          local_138 = 4;
          iVar2 = getsockopt(sock,1,4,&local_134,&local_138);
          return iVar2 == 0 && local_134 == 0;
        }
        if ((local_130.fds_bits[iVar2 >> 6] & uVar6) != 0) {
          return true;
        }
      }
      lVar4 = std::chrono::_V2::system_clock::now();
    } while (SBORROW8(lVar4 - lVar3,lVar5 * 1000000000) != (lVar4 - lVar3) + lVar5 * -1000000000 < 0
            );
  }
  return false;
}

Assistant:

bool check_connect(SOCKET sock, int timeout_second) //, fd_set* rset, fd_set* wset)
    {
        auto begin_time = system_clock::now();

        while (system_clock::now() - begin_time < seconds(timeout_second)) {
            SOCKET high_sock = sock;

            fd_set rset, wset;
            int r = select(high_sock, &rset, &wset);
            if (r == -1 || r == 0 || is_EWOURLDBLOCK(r)) {
                continue;
            }
            else if (FD_ISSET(sock, &rset)) {
                int err = 0;
                socklen_t len = sizeof(err);
                int ret = getsockopt(sock, SOL_SOCKET, SO_ERROR, (char *)&err, &len);
                if (ret != 0) err = 1;

                return err == 0;
            }
            else if (FD_ISSET(sock, &wset)) {
                return true;
            }
        }

        return false;
    }